

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerDivI4(Lowerer *this,Instr *instr)

{
  undefined2 uVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  OpCode opCode;
  BailOutKind BVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  JITTimeFunctionBody *pJVar10;
  Instr *instr_00;
  LabelInstr *target;
  LabelInstr *target_00;
  IntConstOpnd *compareSrc2;
  IntConstOpnd *pIVar11;
  Instr *insertBeforeInstr;
  LabelInstr *target_01;
  LabelInstr *instr_01;
  Lowerer *this_00;
  ulong value;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6aad,"(instr)","instr");
    if (!bVar4) goto LAB_005af408;
    *puVar9 = 0;
  }
  uVar1 = instr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x1c3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6aae,
                       "(instr->m_opcode == Js::OpCode::Div_I4 || instr->m_opcode == Js::OpCode::DivU_I4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Div_I4 || instr->m_opcode == Js::OpCode::DivU_I4"
                      );
    if (!bVar4) goto LAB_005af408;
    *puVar9 = 0;
  }
  if (instr->m_src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6abc,"(instr->GetSrc2())","instr->GetSrc2()");
    if (!bVar4) goto LAB_005af408;
    *puVar9 = 0;
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsWasmFunction(pJVar10);
  if (bVar4) {
LAB_005aef4f:
    bVar4 = LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr,(LabelInstr *)0x0);
    if (bVar4) {
      return;
    }
    LowererMD::EmitInt4Instr(instr);
    return;
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar10);
  if (bVar4) {
    bVar4 = LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr,(LabelInstr *)0x0);
    if (bVar4) {
      return;
    }
    LowerDivI4Common(this,instr);
    return;
  }
  if ((instr->field_0x38 & 0x10) == 0) goto LAB_005aef4f;
  BVar6 = IR::Instr::GetBailOutKind(instr);
  if ((BVar6 & ~(BailOutOnDivSrcConditions|BailOutOnNegativeZero|BailOnDivResultNotInt)) !=
      BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6ad8,
                       "(!(instr->GetBailOutKind() & ~(IR::BailOnDivResultNotInt | IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)))"
                       ,
                       "!(instr->GetBailOutKind() & ~(IR::BailOnDivResultNotInt | IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt))"
                      );
    if (!bVar4) goto LAB_005af408;
    *puVar9 = 0;
  }
  BVar6 = IR::Instr::GetBailOutKind(instr);
  instr_00 = IR::Instr::New(instr->m_opcode,instr->m_func);
  IR::Instr::TransferTo(instr,instr_00);
  IR::Instr::InsertBefore(instr,instr_00);
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  target_00 = GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  pOVar2 = instr_00->m_src1;
  pIVar11 = (IntConstOpnd *)instr_00->m_src2;
  if ((BVar6 >> 0x1d & 1) != 0) {
    this_00 = (Lowerer *)0xffffffff80000000;
    compareSrc2 = IR::IntConstOpnd::New(-0x80000000,TyInt32,this->m_func,true);
    InsertCompareBranch(this_00,pOVar2,&compareSrc2->super_Opnd,BrEq_A,false,target_00,instr_00,
                        false);
  }
  OVar5 = IR::Opnd::GetKind((Opnd *)pIVar11);
  if (OVar5 == OpndKindIntConst) {
    OVar5 = IR::Opnd::GetKind((Opnd *)pIVar11);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_005af408;
      *puVar9 = 0;
    }
    uVar7 = IR::IntConstOpnd::AsInt32(pIVar11);
    if ((0 < (int)uVar7) && ((uVar7 + 0x7fffffff & uVar7) == 0)) {
      if ((BVar6 & (BailOutOnDivByZero|BailOutOnNegativeZero)) != BailOutInvalid) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6af3,
                           "((bailOutKind & (IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero)) == 0)"
                           ,
                           "(bailOutKind & (IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero)) == 0"
                          );
        if (!bVar4) goto LAB_005af408;
        *puVar9 = 0;
      }
      OVar5 = IR::Opnd::GetKind((Opnd *)pIVar11);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar4) {
LAB_005af408:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      uVar7 = IR::IntConstOpnd::AsInt32(pIVar11);
      if ((0 < (int)uVar7) && ((uVar7 + 0x7fffffff & uVar7) == 0)) {
        pIVar11 = IR::Opnd::AsIntConstOpnd((Opnd *)pIVar11);
        uVar8 = IR::IntConstOpnd::AsInt32(pIVar11);
        pIVar11 = IR::IntConstOpnd::New((long)(int)(uVar8 - 1),TyInt32,this->m_func,false);
        InsertTest(pOVar2,&pIVar11->super_Opnd,instr_00);
        InsertBranch(BrNeq_A,false,target_00,instr_00);
        instr_00->m_opcode = Shr_A;
        uVar7 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        value = (ulong)uVar7;
        if (uVar8 < 2) {
          value = 0;
        }
        pIVar11 = IR::IntConstOpnd::New(value,TyInt32,this->m_func,false);
        IR::Instr::ReplaceSrc2(instr_00,&pIVar11->super_Opnd);
        LowererMD::ChangeToShift(instr_00,false);
        LowererMD::Legalize<false>(instr_00,false);
        goto LAB_005af3e6;
      }
      bVar4 = LowererMD::GenerateFastDivAndRem(&this->m_lowererMD,instr_00,target_00);
      if (bVar4) goto LAB_005af3e6;
    }
  }
  if ((BVar6 >> 0x1c & 1) != 0) {
    InsertTest((Opnd *)pIVar11,(Opnd *)pIVar11,instr_00);
    InsertBranch(BrEq_A,false,target_00,instr_00);
  }
  insertBeforeInstr = LowererMD::LowerDivI4AndBailOnReminder(&this->m_lowererMD,instr_00,target_00);
  if ((BVar6 >> 0xc & 1) != 0) {
    pOVar2 = instr_00->m_dst;
    target_01 = IR::LabelInstr::New(Label,this->m_func,false);
    InsertTest(pOVar2,pOVar2,insertBeforeInstr);
    InsertBranch(BrNeq_A,false,target_01,insertBeforeInstr);
    instr_01 = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(insertBeforeInstr,&instr_01->super_Instr);
    opCode = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
    InsertTest((Opnd *)pIVar11,(Opnd *)pIVar11,insertBeforeInstr);
    InsertBranch(opCode,false,target_00,insertBeforeInstr);
    IR::Instr::InsertBefore(insertBeforeInstr,&target_01->super_Instr);
  }
LAB_005af3e6:
  InsertBranch(Br,false,target,&target_00->super_Instr);
  return;
}

Assistant:

void
Lowerer::LowerDivI4(IR::Instr * instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::Div_I4 || instr->m_opcode == Js::OpCode::DivU_I4);

#ifdef _M_IX86
    if (
        instr->GetDst() && instr->GetDst()->IsInt64() ||
        instr->GetSrc1() && instr->GetSrc1()->IsInt64() ||
        instr->GetSrc2() && instr->GetSrc2()->IsInt64()
        )
    {
        m_lowererMD.EmitInt64Instr(instr);
        return;
    }
#endif

    Assert(instr->GetSrc2());
    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        if (!m_lowererMD.GenerateFastDivAndRem(instr))
        {
            m_lowererMD.EmitInt4Instr(instr);
        }
        return;
    }

    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        if (!m_lowererMD.GenerateFastDivAndRem(instr))
        {
            LowerDivI4Common(instr);
        }
        return;
    }

    if(!instr->HasBailOutInfo())
    {
        if (!m_lowererMD.GenerateFastDivAndRem(instr))
        {
            m_lowererMD.EmitInt4Instr(instr);
        }
        return;
    }

    Assert(!(instr->GetBailOutKind() & ~(IR::BailOnDivResultNotInt | IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)));

    IR::BailOutKind bailOutKind = instr->GetBailOutKind();

    // Split out and generate the bailout instruction
    const auto nonBailOutInstr = IR::Instr::New(instr->m_opcode, instr->m_func);
    instr->TransferTo(nonBailOutInstr);
    instr->InsertBefore(nonBailOutInstr);

    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    instr->InsertAfter(doneLabel);

    // Generate the bailout helper call. 'instr' will be changed to the CALL into the bailout function, so it can't be used for
    // ordering instructions anymore.
    IR::LabelInstr * bailOutLabel = GenerateBailOut(instr);

    IR::Opnd * denominatorOpnd = nonBailOutInstr->GetSrc2();
    IR::Opnd * nominatorOpnd = nonBailOutInstr->GetSrc1();
    bool isFastDiv = false;
    if (bailOutKind & IR::BailOutOnDivOfMinInt)
    {
        // Bailout if numerator is MIN_INT  (could also check for denominator being -1
        // before bailing out, but does not seem worth the extra code..)
        InsertCompareBranch(nominatorOpnd, IR::IntConstOpnd::New(INT32_MIN, TyInt32, this->m_func, true), Js::OpCode::BrEq_A, bailOutLabel, nonBailOutInstr);
    }
    if (denominatorOpnd->IsIntConstOpnd() && Math::IsPow2(denominatorOpnd->AsIntConstOpnd()->AsInt32()))
    {
        Assert((bailOutKind & (IR::BailOutOnNegativeZero | IR::BailOutOnDivByZero)) == 0);
        if (Math::IsPow2(denominatorOpnd->AsIntConstOpnd()->AsInt32()))
        {
            int pow2 = denominatorOpnd->AsIntConstOpnd()->AsInt32();
            InsertTestBranch(nominatorOpnd, IR::IntConstOpnd::New(pow2 - 1, TyInt32, this->m_func),
                Js::OpCode::BrNeq_A, bailOutLabel, nonBailOutInstr);
            nonBailOutInstr->m_opcode = Js::OpCode::Shr_A;
            nonBailOutInstr->ReplaceSrc2(IR::IntConstOpnd::New(Math::Log2(pow2), TyInt32, this->m_func));
            LowererMD::ChangeToShift(nonBailOutInstr, false);
            LowererMD::Legalize(nonBailOutInstr);
            isFastDiv = true;
        }
        else
        {
            isFastDiv = m_lowererMD.GenerateFastDivAndRem(nonBailOutInstr, bailOutLabel);
        }

    }
    if (!isFastDiv)
    {
        if (bailOutKind & IR::BailOutOnDivByZero)
        {
            // Bailout if denominator is 0
            InsertTestBranch(denominatorOpnd, denominatorOpnd, Js::OpCode::BrEq_A, bailOutLabel, nonBailOutInstr);
        }

        // Lower the div and bailout if there is a reminder (machine specific)
        IR::Instr * insertBeforeInstr = m_lowererMD.LowerDivI4AndBailOnReminder(nonBailOutInstr, bailOutLabel);

        IR::Opnd * resultOpnd = nonBailOutInstr->GetDst();
        if (bailOutKind & IR::BailOutOnNegativeZero)
        {
            //      TEST result, result
            //      JNE skipNegDenominatorCheckLabel         // Result not 0
            //      TEST denominator, denominator
            //      JNSB/BMI bailout                         // bail if negative
            // skipNegDenominatorCheckLabel:

            IR::LabelInstr * skipNegDenominatorCheckLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            // Skip negative denominator check if the result is not 0
            InsertTestBranch(resultOpnd, resultOpnd, Js::OpCode::BrNeq_A, skipNegDenominatorCheckLabel, insertBeforeInstr);

            IR::LabelInstr * negDenominatorCheckLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
            insertBeforeInstr->InsertBefore(negDenominatorCheckLabel);
            // Jump to done if the denominator is not negative
            InsertTestBranch(denominatorOpnd, denominatorOpnd,
                LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), bailOutLabel, insertBeforeInstr);
            insertBeforeInstr->InsertBefore(skipNegDenominatorCheckLabel);
        }
    }

    // We are all fine, jump around the bailout to done
    InsertBranch(Js::OpCode::Br, doneLabel, bailOutLabel);
}